

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_frameHeaderSize_internal(void *src,size_t srcSize,ZSTD_format_e format)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  ulong in_RSI;
  long in_RDI;
  U32 fcsId;
  U32 singleSegment;
  U32 dictID;
  BYTE fhd;
  size_t minInputSize;
  ZSTD_format_e in_stack_ffffffffffffffc4;
  size_t local_8;
  
  sVar4 = ZSTD_startingInputLength(in_stack_ffffffffffffffc4);
  if (in_RSI < sVar4) {
    local_8 = 0xffffffffffffffb8;
  }
  else {
    bVar1 = *(byte *)(in_RDI + (sVar4 - 1));
    uVar3 = (int)(uint)bVar1 >> 5 & 1;
    bVar2 = 0;
    if (uVar3 != 0) {
      bVar2 = (int)(uint)bVar1 >> 6 != 0U ^ 0xff;
    }
    local_8 = sVar4 + (long)(int)(uint)((uVar3 != 0 ^ 0xffU) & 1) + ZSTD_did_fieldSize[bVar1 & 3] +
              ZSTD_fcs_fieldSize[(uint)((int)(uint)bVar1 >> 6)] + (long)(int)(uint)(bVar2 & 1);
  }
  return local_8;
}

Assistant:

static size_t ZSTD_frameHeaderSize_internal(const void* src, size_t srcSize, ZSTD_format_e format)
{
    size_t const minInputSize = ZSTD_startingInputLength(format);
    RETURN_ERROR_IF(srcSize < minInputSize, srcSize_wrong, "");

    {   BYTE const fhd = ((const BYTE*)src)[minInputSize-1];
        U32 const dictID= fhd & 3;
        U32 const singleSegment = (fhd >> 5) & 1;
        U32 const fcsId = fhd >> 6;
        return minInputSize + !singleSegment
             + ZSTD_did_fieldSize[dictID] + ZSTD_fcs_fieldSize[fcsId]
             + (singleSegment && !fcsId);
    }
}